

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pomdp.cpp
# Opt level: O2

ParticleLowerBound * __thiscall
despot::DSPOMDP::CreateParticleLowerBound(DSPOMDP *this,string *name)

{
  bool bVar1;
  TrivialParticleLowerBound *this_00;
  ostream *poVar2;
  
  bVar1 = std::operator==(name,"TRIVIAL");
  if (!bVar1) {
    bVar1 = std::operator==(name,"DEFAULT");
    if (!bVar1) {
      bVar1 = std::operator!=(name,"print");
      if (bVar1) {
        poVar2 = std::operator<<((ostream *)&std::cerr,"Unsupported particle lower bound: ");
        poVar2 = std::operator<<(poVar2,(string *)name);
        std::endl<char,std::char_traits<char>>(poVar2);
      }
      poVar2 = std::operator<<((ostream *)&std::cerr,"Supported types: TRIVIAL (default)");
      std::endl<char,std::char_traits<char>>(poVar2);
      exit(1);
    }
  }
  this_00 = (TrivialParticleLowerBound *)operator_new(0x10);
  TrivialParticleLowerBound::TrivialParticleLowerBound(this_00,this);
  return &this_00->super_ParticleLowerBound;
}

Assistant:

ParticleLowerBound* DSPOMDP::CreateParticleLowerBound(string name) const {
	if (name == "TRIVIAL" || name == "DEFAULT") {
		return new TrivialParticleLowerBound(this);
	} else {
		if (name != "print")
			cerr << "Unsupported particle lower bound: " << name << endl;
		cerr << "Supported types: TRIVIAL (default)" << endl;
		exit(1);
		return NULL;
	}
}